

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O3

void inmateMove(UnitList *inmateList,Path *path)

{
  uint uVar1;
  TileNode *pTVar2;
  undefined1 *puVar3;
  TileNode *pTVar4;
  UnitNode *pUVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  
  if (inmateList == (UnitList *)0x0) {
    pUVar5 = (UnitNode *)0x0;
  }
  else {
    pUVar5 = inmateList->head;
  }
  uVar1 = path->count;
  pTVar2 = path->first;
  do {
    puVar3 = (undefined1 *)pUVar5->unit;
    iVar6 = (int)*(float *)(puVar3 + 4);
    uVar7 = uVar1;
    for (pTVar4 = pTVar2; (uVar7 != 0 && (pTVar4->location != iVar6)); pTVar4 = pTVar4->next) {
      uVar7 = uVar7 - 1;
    }
    fVar8 = *(float *)(puVar3 + 4) + (float)*(uint *)(puVar3 + 0x10) * 0.125;
    *(float *)(puVar3 + 4) = fVar8;
    if (iVar6 + 1 == (int)fVar8) {
      if (pTVar4->next == (TileNode *)0x0) {
        *puVar3 = 1;
      }
      else {
        *(float *)(puVar3 + 4) = (float)pTVar4->next->location;
      }
    }
    pUVar5 = pUVar5->next;
  } while ((pUVar5 != (UnitNode *)0x0) && (pUVar5->next != (UnitNode *)0x0));
  return;
}

Assistant:

void inmateMove(struct UnitList *inmateList, struct Path *path) {
    struct UnitNode *nextInmate;
    struct TileNode *nextTile;
    int prevPos;

    nextInmate = getHead(inmateList);
    do {
        nextTile = path->first;
        for (int i = 0; i < path->count; i++) {
            if (nextTile->location ==
                (int) ((struct Inmate *) nextInmate->unit)->position)
                break;
            nextTile = nextTile->next;
        }
        prevPos = ((struct Inmate *) nextInmate->unit)->position;
        ((struct Inmate *) nextInmate->unit)->position =
            ((struct Inmate *) nextInmate->unit)->position +
                (float) ((struct Inmate *) nextInmate->unit)->speed / 8;
        if ((int) ((struct Inmate *) nextInmate->unit)->position ==
            prevPos + 1 && nextTile->next != NULL)
            ((struct Inmate *) nextInmate->unit)->position = nextTile->next->location;
        else if ((int) ((struct Inmate *) nextInmate->unit)->position ==
            prevPos + 1 && nextTile->next == NULL) {
            ((struct Inmate *) nextInmate->unit)->delUnit = TRUE;
            //endwin();
        }
        nextInmate = getNext(nextInmate);
    } while (getNext(nextInmate));
}